

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O1

int __thiscall menuwindow::is_inside(menuwindow *this,int mx,int my)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = Fl_Window::x_root((Fl_Window *)this);
  iVar3 = 0;
  iVar2 = 0;
  if ((((iVar1 <= mx) &&
       (iVar1 = Fl_Window::x_root((Fl_Window *)this), iVar2 = iVar3,
       mx < iVar1 + (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                    super_Fl_Group.super_Fl_Widget.w_)) &&
      (iVar1 = Fl_Window::y_root((Fl_Window *)this), iVar1 <= my)) &&
     (iVar1 = Fl_Window::y_root((Fl_Window *)this),
     my < iVar1 + (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group
                  .super_Fl_Widget.h_)) {
    if ((this->itemheight == 0) && (iVar2 = find_selected(this,mx,my), iVar2 == -1)) {
      return 0;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int menuwindow::is_inside(int mx, int my) {
  if ( mx < x_root() || mx >= x_root() + w() ||
       my < y_root() || my >= y_root() + h()) {
    return 0;
  }
  if (itemheight == 0 && find_selected(mx, my) == -1) {
    // in the menubar but out from any menu header
    return 0;
    }
  return 1;
}